

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzrot::VariablesQbIncrementPosition(ChNodeFEAxyzrot *this,double step)

{
  double dVar1;
  double dVar2;
  ChQuaternion<double> local_f0;
  ChQuaternion<double> local_d0;
  ChVector<double> newwel_abs;
  ChVector<double> newspeed;
  ChVector<double> newwel;
  ChQuaternion<double> mnewrot;
  
  ChVariables::Get_qb((ChVectorRef *)&local_f0,(ChVariables *)&this->variables);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)&local_d0,
              (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&local_f0,0,
              3);
  ChVector<double>::
  ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
            (&newspeed,
             (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
              *)&local_d0,(type *)0x0);
  ChVariables::Get_qb((ChVectorRef *)&local_f0,(ChVariables *)&this->variables);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)&local_d0,
              (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&local_f0,3,
              3);
  ChVector<double>::
  ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
            (&newwel,(MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                      *)&local_d0,(type *)0x0);
  dVar1 = *(double *)&this->field_0x30;
  dVar2 = *(double *)&this->field_0x28;
  *(double *)&(this->super_ChNodeFEAbase).field_0x20 =
       step * newspeed.m_data[0] + *(double *)&(this->super_ChNodeFEAbase).field_0x20;
  *(double *)&this->field_0x28 = step * newspeed.m_data[1] + dVar2;
  *(double *)&this->field_0x30 = step * newspeed.m_data[2] + dVar1;
  local_f0.m_data[0] = *(double *)&this->field_0x38;
  local_f0.m_data[1] = *(double *)&this->field_0x40;
  local_f0.m_data[2] = *(double *)&this->field_0x48;
  local_f0.m_data[3] = *(double *)&this->field_0x50;
  ChMatrix33<double>::operator*((ChMatrix33<double> *)&this->field_0x58,&newwel);
  dVar1 = ChVector<double>::Length(&newwel_abs);
  ChVector<double>::Normalize(&newwel_abs);
  dVar1 = dVar1 * step * 0.5;
  dVar2 = sin(dVar1);
  local_d0.m_data[0] = cos(dVar1);
  local_d0.m_data[1] = dVar2 * newwel_abs.m_data[0];
  local_d0.m_data[2] = dVar2 * newwel_abs.m_data[1];
  local_d0.m_data[3] = dVar2 * newwel_abs.m_data[2];
  ChQuaternion<double>::operator%(&mnewrot,&local_d0,&local_f0);
  ChFrame<double>::SetRot((ChFrame<double> *)&(this->super_ChNodeFEAbase).field_0x18,&mnewrot);
  return;
}

Assistant:

void ChNodeFEAxyzrot::VariablesQbIncrementPosition(double step) {
    // if (!this->IsActive())
    //	return;

    // Updates position with incremental action of speed contained in the
    // 'qb' vector:  pos' = pos + dt * speed   , like in an Eulero step.

    ChVector<> newspeed(variables.Get_qb().segment(0, 3));
    ChVector<> newwel(variables.Get_qb().segment(3, 3));

    // ADVANCE POSITION: pos' = pos + dt * vel
    this->SetPos(this->GetPos() + newspeed * step);

    // ADVANCE ROTATION: rot' = [dt*wwel]%rot  (use quaternion for delta rotation)
    ChQuaternion<> mdeltarot;
    ChQuaternion<> moldrot = this->GetRot();
    ChVector<> newwel_abs = this->Amatrix * newwel;
    double mangle = newwel_abs.Length() * step;
    newwel_abs.Normalize();
    mdeltarot.Q_from_AngAxis(mangle, newwel_abs);
    ChQuaternion<> mnewrot = mdeltarot % moldrot;
    this->SetRot(mnewrot);
}